

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O0

void __thiscall Buffer::Buffer(Buffer *this,size_t size)

{
  Members *this_00;
  size_t size_local;
  Buffer *this_local;
  
  this_00 = (Members *)operator_new(0x38);
  Members::Members(this_00,size,(uchar *)0x0,true);
  std::unique_ptr<Buffer::Members,std::default_delete<Buffer::Members>>::
  unique_ptr<std::default_delete<Buffer::Members>,void>
            ((unique_ptr<Buffer::Members,std::default_delete<Buffer::Members>> *)this,this_00);
  return;
}

Assistant:

Buffer::Buffer(size_t size) :
    m(new Members(size, nullptr, true))
{
}